

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUtil.c
# Opt level: O2

void Abc_SclMinsizePerform(SC_Lib *pLib,Abc_Ntk_t *p,int fUseMax,int fVerbose)

{
  int iVar1;
  Vec_Int_t *p_00;
  Abc_Ntk_t *pObj;
  int i;
  Abc_Ntk_t *pLib_00;
  
  p_00 = Abc_SclFindMinAreas(pLib,fUseMax);
  pLib_00 = (Abc_Ntk_t *)pLib;
  Abc_SclMioGates2SclGates(pLib,p);
  i = 0;
  do {
    if (p->vObjs->nSize <= i) {
      Abc_SclSclGates2MioGates((SC_Lib *)pLib_00,p);
      Vec_IntFree(p_00);
      return;
    }
    pLib_00 = p;
    pObj = (Abc_Ntk_t *)Abc_NtkObj(p,i);
    if (((pObj != (Abc_Ntk_t *)0x0) && (((ulong)pObj->pSpec & 0xf00000000) == 0x700000000)) &&
       (((Vec_Int_t *)&pObj->pManName)->nSize != 0)) {
      iVar1 = Abc_ObjIsBarBuf((Abc_Obj_t *)pObj);
      pLib_00 = pObj;
      if (iVar1 == 0) {
        iVar1 = Vec_IntEntry(p->vGates,i);
        if ((iVar1 < 0) || ((pLib->vCells).nSize <= iVar1)) {
          __assert_fail("gateId >= 0 && gateId < Vec_PtrSize(&pLib->vCells)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUtil.c"
                        ,0xd6,"void Abc_SclMinsizePerform(SC_Lib *, Abc_Ntk_t *, int, int)");
        }
        iVar1 = Vec_IntEntry(p_00,iVar1);
        if ((iVar1 < 0) || ((pLib->vCells).nSize <= iVar1)) {
          __assert_fail("gateId >= 0 && gateId < Vec_PtrSize(&pLib->vCells)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUtil.c"
                        ,0xd8,"void Abc_SclMinsizePerform(SC_Lib *, Abc_Ntk_t *, int, int)");
        }
        pLib_00 = (Abc_Ntk_t *)p->vGates;
        Vec_IntWriteEntry((Vec_Int_t *)pLib_00,i,iVar1);
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

void Abc_SclMinsizePerform( SC_Lib * pLib, Abc_Ntk_t * p, int fUseMax, int fVerbose )
{
    Vec_Int_t * vMinCells;
    Abc_Obj_t * pObj;
    int i, gateId;
    vMinCells = Abc_SclFindMinAreas( pLib, fUseMax );
    Abc_SclMioGates2SclGates( pLib, p );
    Abc_NtkForEachNodeNotBarBuf1( p, pObj, i )
    {
        gateId = Vec_IntEntry( p->vGates, i );
        assert( gateId >= 0 && gateId < Vec_PtrSize(&pLib->vCells) );
        gateId = Vec_IntEntry( vMinCells, gateId );
        assert( gateId >= 0 && gateId < Vec_PtrSize(&pLib->vCells) );
        Vec_IntWriteEntry( p->vGates, i, gateId );
    }
    Abc_SclSclGates2MioGates( pLib, p );
    Vec_IntFree( vMinCells );
}